

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

bool anon_unknown.dwarf_161d410::isUnionMemberType(Type *left,Type *right)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  Type *rhs;
  Scope *this;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar4;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin1;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_30;
  
  pTVar3 = slang::ast::Type::getCanonicalType(left);
  rhs = slang::ast::Type::getCanonicalType(right);
  bVar1 = slang::ast::Type::isPackedUnion(pTVar3);
  if (bVar1) {
    this = slang::ast::Symbol::scopeOrNull(&pTVar3->super_Symbol);
    sVar4 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(this);
    local_30 = sVar4._M_begin.current;
    while (bVar1 = local_30.current != sVar4._M_end.current.current, bVar1) {
      pTVar3 = slang::ast::DeclaredType::getType((DeclaredType *)(local_30.current + 1));
      bVar2 = slang::ast::Type::isMatching(pTVar3,rhs);
      if (bVar2) {
        return bVar1;
      }
      bVar2 = isUnionMemberType(pTVar3,rhs);
      if (bVar2) {
        return bVar1;
      }
      slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment(&local_30);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isUnionMemberType(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (!lt.isPackedUnion())
        return false;

    for (auto& field : lt.as<Scope>().membersOfType<FieldSymbol>()) {
        auto& ft = field.getType();
        if (ft.isMatching(rt) || isUnionMemberType(ft, rt))
            return true;
    }
    return false;
}